

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  short sVar1;
  Index *pIVar2;
  Schema *pSchema;
  Op *pOVar3;
  FKey *pFVar4;
  uint p2;
  sqlite_int64 iRow_00;
  int iVar5;
  int err_code;
  Incrblob *p;
  Parse *pParse;
  Table *pTVar6;
  Index **ppIVar7;
  Vdbe *p_00;
  FKey **ppFVar8;
  uint iLineno;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  char *local_90;
  int local_88;
  uint local_84;
  Parse *local_80;
  Incrblob *local_78;
  uint local_70;
  int local_6c;
  sqlite3 *local_68;
  char *local_60;
  char *local_58;
  ulong local_50;
  char **local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_90 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_88 = flags;
  local_60 = zTable;
  local_58 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = (Incrblob *)sqlite3DbMallocZero(db,0x28);
  pParse = (Parse *)0x0;
  if (p == (Incrblob *)0x0) {
LAB_0011344f:
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p;
      err_code = 0;
      goto LAB_001134d3;
    }
    err_code = 0;
LAB_00113458:
    if (p != (Incrblob *)0x0) goto LAB_001134ba;
  }
  else {
    pParse = (Parse *)sqlite3DbMallocRaw(db,0x288);
    if (pParse == (Parse *)0x0) {
      pParse = (Parse *)0x0;
      goto LAB_0011344f;
    }
    p2 = (uint)(flags != 0);
    local_70 = local_88 != 0 ^ 3;
    local_50 = (ulong)(local_88 != 0 | 2);
    local_48 = &pParse->zErrMsg;
    local_84 = 0;
    local_80 = pParse;
    local_78 = p;
    local_68 = db;
    iVar5 = 0;
    do {
      local_6c = iVar5;
      memset(local_48,0,0x280);
      pParse->db = db;
      sqlite3DbFree(db,local_90);
      local_90 = (char *)0x0;
      sqlite3BtreeEnterAll(db);
      pTVar6 = sqlite3LocateTable(pParse,0,local_60,local_38);
      if (pTVar6 == (Table *)0x0) {
LAB_0011348f:
        if (pParse->zErrMsg != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_90 = pParse->zErrMsg;
          pParse->zErrMsg = (char *)0x0;
        }
        sqlite3BtreeLeaveAll(db);
        err_code = 1;
        goto LAB_001134ba;
      }
      if ((pTVar6->tabFlags & 0x10) != 0) {
        pcVar14 = "cannot open virtual table: %s";
LAB_00113480:
        sqlite3ErrorMsg(pParse,pcVar14,local_60);
        goto LAB_0011348f;
      }
      if ((pTVar6->tabFlags & 0x20) != 0) {
        pcVar14 = "cannot open table without rowid: %s";
        goto LAB_00113480;
      }
      if (pTVar6->pSelect != (Select *)0x0) {
        pcVar14 = "cannot open view: %s";
        goto LAB_00113480;
      }
      sVar1 = pTVar6->nCol;
      uVar12 = 0;
      if (0 < sVar1) {
        uVar12 = (ulong)(uint)(int)sVar1;
      }
      lVar9 = 0;
      for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        iVar5 = sqlite3_stricmp(*(char **)((long)&pTVar6->aCol->zName + lVar9),local_58);
        if (iVar5 == 0) {
          uVar12 = uVar13 & 0xffffffff;
          break;
        }
        lVar9 = lVar9 + 0x30;
      }
      db = local_68;
      uVar11 = (uint)uVar12;
      if (uVar11 == (int)sVar1) {
        sqlite3DbFree(local_68,(void *)0x0);
        pcVar10 = "no such column: \"%s\"";
        pcVar14 = local_58;
LAB_00113576:
        local_90 = sqlite3MPrintf(db,pcVar10,pcVar14);
        sqlite3BtreeLeaveAll(db);
        err_code = 1;
        pParse = local_80;
        p = local_78;
        goto LAB_00113458;
      }
      if (local_88 != 0) {
        if ((local_68->flags & 0x80000) == 0) {
          pcVar14 = (char *)0x0;
        }
        else {
          pcVar14 = (char *)0x0;
          ppFVar8 = &pTVar6->pFKey;
          while (pFVar4 = *ppFVar8, pFVar4 != (FKey *)0x0) {
            uVar12 = (ulong)(uint)pFVar4->nCol;
            if (pFVar4->nCol < 1) {
              uVar12 = 0;
            }
            for (lVar9 = 0; uVar12 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
              if (*(uint *)((long)&pFVar4->aCol[0].iFrom + lVar9) == uVar11) {
                pcVar14 = "foreign key";
              }
            }
            ppFVar8 = &pFVar4->pNextFrom;
          }
        }
        ppIVar7 = &pTVar6->pIndex;
        while (pIVar2 = *ppIVar7, pIVar2 != (Index *)0x0) {
          for (uVar12 = 0; pIVar2->nKeyCol != uVar12; uVar12 = uVar12 + 1) {
            if (uVar11 == (int)pIVar2->aiColumn[uVar12]) {
              pcVar14 = "indexed";
            }
          }
          ppIVar7 = &pIVar2->pNext;
        }
        if (pcVar14 != (char *)0x0) {
          sqlite3DbFree(local_68,(void *)0x0);
          pcVar10 = "cannot open %s column for writing";
          goto LAB_00113576;
        }
      }
      p_00 = sqlite3VdbeCreate(local_80);
      local_78->pStmt = (sqlite3_stmt *)p_00;
      if (p_00 != (Vdbe *)0x0) {
        pSchema = pTVar6->pSchema;
        iVar5 = sqlite3SchemaToIndex(db,pSchema);
        iLineno = p2;
        sqlite3VdbeAddOp4Int(p_00,4,iVar5,p2,pSchema->schema_cookie,pSchema->iGeneration);
        if (p_00->aOp != (Op *)0x0) {
          iLineno = p_00->nOp * 0x18;
          p_00->aOp[(long)p_00->nOp + -1].p5 = '\x01';
        }
        sqlite3VdbeAddOpList(p_00,10,sqlite3_blob_open::openBlob,iLineno);
        sqlite3VdbeUsesBtree(p_00,iVar5);
        if (1 < (uint)p_00->nOp) {
          pOVar3 = p_00->aOp;
          pOVar3[1].p1 = iVar5;
          pOVar3[1].p2 = pTVar6->tnum;
          pOVar3[1].p3 = p2;
        }
        sqlite3VdbeChangeP4(p_00,1,pTVar6->zName,0);
        sqlite3VdbeChangeToNoop(p_00,local_70);
        if ((uint)local_50 < (uint)p_00->nOp) {
          pOVar3 = p_00->aOp;
          pOVar3[local_50].p2 = pTVar6->tnum;
          pOVar3[local_50].p3 = iVar5;
        }
        sqlite3VdbeChangeP4(p_00,(uint)local_50,(char *)((long)pTVar6->nCol + 1),-0xe);
        db = local_68;
        if (6 < (uint)p_00->nOp) {
          p_00->aOp[6].p2 = (int)pTVar6->nCol;
        }
        if (local_68->mallocFailed == '\0') {
          local_80->nVar = 1;
          local_80->nTab = 1;
          local_80->nMem = 1;
          sqlite3VdbeMakeReady(p_00,local_80);
        }
      }
      p = local_78;
      local_78->flags = p2;
      local_78->iCol = uVar11;
      local_78->db = db;
      sqlite3BtreeLeaveAll(db);
      iRow_00 = local_40;
      pParse = local_80;
      err_code = local_6c;
      if (db->mallocFailed != '\0') break;
      sqlite3_bind_int64(p->pStmt,1,local_40);
      err_code = blobSeekToRow(p,iRow_00,&local_90);
      if (0x30 < local_84) break;
      local_84 = local_84 + 1;
      iVar5 = 0x11;
    } while (err_code == 0x11);
    if (err_code == 0) goto LAB_0011344f;
LAB_001134ba:
    if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
  }
  sqlite3DbFree(db,p);
LAB_001134d3:
  pcVar10 = local_90;
  pcVar14 = "%s";
  if (local_90 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,err_code,pcVar14,local_90);
  sqlite3DbFree(db,pcVar10);
  sqlite3ParserReset(pParse);
  sqlite3DbFree(db,pParse);
  iVar5 = sqlite3ApiExit(db,err_code);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar5;
}

Assistant:

SQLITE_STDCALL sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const int iLn = VDBE_OFFSET_LINENO(4);
  static const VdbeOpList openBlob[] = {
    /* {OP_Transaction, 0, 0, 0},  // 0: Inserted separately */
    {OP_TableLock, 0, 0, 0},       /* 1: Acquire a read or write lock */
    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 2: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 3: Open cursor 0 for read/write */
    {OP_Variable, 1, 1, 1},        /* 4: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 5: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 6  */
    {OP_ResultRow, 1, 0, 0},       /* 7  */
    {OP_Goto, 0, 4, 0},            /* 8  */
    {OP_Close, 0, 0, 0},           /* 9  */
    {OP_Halt, 0, 0, 0},            /* 10 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  flags = !!flags;                /* flags = (flags ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);


      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, flags, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 1);
#else
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->tnum);
      sqlite3VdbeChangeP3(v, 1, flags);
      sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 3 - flags);
      sqlite3VdbeChangeP2(v, 2 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 2+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 6, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}